

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdComputeSchnorrSigPoint(void *handle,char *msg,char *nonce,char *pubkey,char **sigpoint)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  Pubkey sig_point;
  int result;
  string *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffd30;
  allocator *paVar4;
  string *in_stack_fffffffffffffd70;
  string local_240;
  allocator local_219;
  string local_218;
  SchnorrPubkey local_1f8;
  allocator local_1d9;
  string local_1d8;
  SchnorrPubkey local_1b8;
  allocator local_199;
  string local_198;
  ByteData256 local_178;
  Pubkey local_160;
  undefined1 local_142;
  allocator local_141;
  string local_140 [32];
  CfdSourceLocation local_120;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  undefined4 local_34;
  undefined8 *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  local_34 = 0xffffffff;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x308;
    local_60.funcname = "CfdComputeSchnorrSigPoint";
    cfd::core::logger::warn<>(&local_60,"msg is null or empty.");
    local_82 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. msg is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd30,error_code,in_stack_fffffffffffffd20);
    local_82 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0x30e;
    local_a0.funcname = "CfdComputeSchnorrSigPoint";
    cfd::core::logger::warn<>(&local_a0,"nonce is null or empty.");
    local_c2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Failed to parameter. nonce is null or empty.",&local_c1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd30,error_code,in_stack_fffffffffffffd20);
    local_c2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x314;
    local_e0.funcname = "CfdComputeSchnorrSigPoint";
    cfd::core::logger::warn<>(&local_e0,"pubkey is null or empty.");
    local_102 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_101;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"Failed to parameter. pubkey is null or empty.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd30,error_code,in_stack_fffffffffffffd20);
    local_102 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_30 == (undefined8 *)0x0) {
    local_120.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_120.filename = local_120.filename + 1;
    local_120.line = 0x31a;
    local_120.funcname = "CfdComputeSchnorrSigPoint";
    cfd::core::logger::warn<>(&local_120,"sigpoint is null.");
    local_142 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"Failed to parameter. sigpoint is null.",&local_141);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd30,error_code,in_stack_fffffffffffffd20);
    local_142 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,local_18,&local_199);
  cfd::core::ByteData256::ByteData256(&local_178,&local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,local_20,&local_1d9);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_1b8,&local_1d8);
  paVar4 = &local_219;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,local_28,paVar4);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_1f8,&local_218);
  cfd::core::SchnorrUtil::ComputeSigPoint(&local_160,&local_178,&local_1b8,&local_1f8);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x5d29e2);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x5d2a09);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5d2a30);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_240,&local_160);
  pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffd70);
  *local_30 = pcVar3;
  std::__cxx11::string::~string((string *)&local_240);
  local_4 = 0;
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x5d2aaa);
  return local_4;
}

Assistant:

int CfdComputeSchnorrSigPoint(
    void* handle, const char* msg, const char* nonce, const char* pubkey,
    char** sigpoint) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(nonce)) {
      warn(CFD_LOG_SOURCE, "nonce is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. nonce is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (sigpoint == nullptr) {
      warn(CFD_LOG_SOURCE, "sigpoint is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sigpoint is null.");
    }

    Pubkey sig_point = SchnorrUtil::ComputeSigPoint(
        ByteData256(msg), SchnorrPubkey(nonce), SchnorrPubkey(pubkey));

    *sigpoint = CreateString(sig_point.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}